

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O0

bool __thiscall
quic::Bbr2ProbeBwMode::IsTimeToProbeForRenoCoexistence
          (Bbr2ProbeBwMode *this,double probe_wait_fraction,Bbr2CongestionEvent *param_2)

{
  QuicRoundTripCount QVar1;
  Bbr2Params *pBVar2;
  unsigned_long *puVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float local_4c;
  ulong uStack_38;
  bool result;
  uint64_t reno_rounds;
  QuicByteCount target_bytes_inflight;
  uint64_t rounds;
  Bbr2CongestionEvent *param_2_local;
  double probe_wait_fraction_local;
  Bbr2ProbeBwMode *this_local;
  
  rounds = (uint64_t)param_2;
  param_2_local = (Bbr2CongestionEvent *)probe_wait_fraction;
  probe_wait_fraction_local = (double)this;
  pBVar2 = Params(this);
  target_bytes_inflight = (QuicByteCount)pBVar2->probe_bw_probe_max_rounds;
  pBVar2 = Params(this);
  if (0.0 < pBVar2->probe_bw_probe_reno_gain) {
    reno_rounds = Bbr2Sender::GetTargetBytesInflight((this->super_Bbr2ModeBase).sender_);
    pBVar2 = Params(this);
    local_4c = (float)reno_rounds;
    fVar4 = (pBVar2->probe_bw_probe_reno_gain * local_4c) / 1460.0;
    uStack_38 = (ulong)fVar4;
    uStack_38 = uStack_38 | (long)(fVar4 - 9.223372e+18) & (long)uStack_38 >> 0x3f;
    puVar3 = std::min<unsigned_long>(&target_bytes_inflight,&stack0xffffffffffffffc8);
    target_bytes_inflight = *puVar3;
  }
  QVar1 = (this->cycle_).rounds_since_probe;
  auVar5._8_4_ = (int)(QVar1 >> 0x20);
  auVar5._0_8_ = QVar1;
  auVar5._12_4_ = 0x45300000;
  auVar6._8_4_ = (int)(target_bytes_inflight >> 0x20);
  auVar6._0_8_ = target_bytes_inflight;
  auVar6._12_4_ = 0x45300000;
  return ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)target_bytes_inflight) - 4503599627370496.0)) *
         (double)param_2_local <=
         (auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)QVar1) - 4503599627370496.0);
}

Assistant:

bool Bbr2ProbeBwMode::IsTimeToProbeForRenoCoexistence(
    double probe_wait_fraction,
    const Bbr2CongestionEvent& /*congestion_event*/) const {
  uint64_t rounds = Params().probe_bw_probe_max_rounds;
  if (Params().probe_bw_probe_reno_gain > 0.0) {
    QuicByteCount target_bytes_inflight = sender_->GetTargetBytesInflight();
    uint64_t reno_rounds = Params().probe_bw_probe_reno_gain *
                           target_bytes_inflight / kDefaultTCPMSS;
    rounds = std::min(rounds, reno_rounds);
  }
  bool result = cycle_.rounds_since_probe >= (rounds * probe_wait_fraction);
 /* QUIC_DVLOG(3) << sender_ << " " << cycle_.phase
                << ": IsTimeToProbeForRenoCoexistence=" << result
                << ". rounds_since_probe:" << cycle_.rounds_since_probe
                << ", rounds:" << rounds
                << ", probe_wait_fraction:" << probe_wait_fraction;*/
  return result;
}